

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O2

void M_FindResponseFile(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  FILE *__stream;
  long lVar5;
  char **argv;
  DArgs *this;
  char *copyStr;
  int k;
  BYTE *pBVar6;
  uint uVar7;
  int iVar8;
  int argc;
  int local_58;
  uint local_54;
  char *local_50;
  FString local_48;
  FString local_40;
  FString local_38;
  
  iVar8 = 1;
  local_58 = 2;
  uVar7 = 0;
  while (iVar1 = DArgs::NumArgs(Args), iVar8 < iVar1) {
    pcVar4 = DArgs::GetArg(Args,iVar8);
    if (*pcVar4 == '@') {
      argc = 0;
      pcVar4 = DArgs::GetArg(Args,iVar8);
      if ((int)uVar7 < 100) {
        __stream = fopen(pcVar4 + 1,"rb");
        pcVar4 = DArgs::GetArg(Args,iVar8);
        if (__stream == (FILE *)0x0) {
          Printf("No such response file (%s)!\n",pcVar4 + 1);
          pcVar4 = (char *)0x0;
          lVar5 = 0;
        }
        else {
          Printf("Found response file %s!\n");
          fseek(__stream,0,2);
          lVar5 = ftell(__stream);
          fseek(__stream,0,0);
          iVar1 = (int)lVar5;
          pcVar4 = (char *)operator_new__((long)(iVar1 + 1));
          fread(pcVar4,(long)iVar1,1,__stream);
          pcVar4[iVar1] = '\0';
          fclose(__stream);
          lVar5 = ParseCommandLine(pcVar4,&argc,(char **)0x0);
        }
      }
      else {
        Printf("Ignored response file %s.\n",pcVar4 + 1);
        pcVar4 = (char *)0x0;
        lVar5 = 0;
      }
      if ((long)argc == 0) {
        DArgs::RemoveArg(Args,iVar8);
      }
      else {
        local_54 = uVar7;
        argv = (char **)M_Malloc_Dbg(lVar5 + (long)argc * 8,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/m_misc.cpp"
                                     ,0xe3);
        *argv = (char *)(argv + argc);
        ParseCommandLine(pcVar4,(int *)0x0,argv);
        this = (DArgs *)DObject::operator_new(0x38);
        DArgs::DArgs(this);
        for (iVar1 = 0; iVar8 != iVar1; iVar1 = iVar1 + 1) {
          copyStr = DArgs::GetArg(Args,iVar1);
          FString::FString(&local_38,copyStr);
          DArgs::AppendArg(this,&local_38);
          FString::~FString(&local_38);
        }
        local_50 = pcVar4;
        for (lVar5 = 0; lVar5 < argc; lVar5 = lVar5 + 1) {
          FString::FString(&local_40,argv[lVar5]);
          DArgs::AppendArg(this,&local_40);
          FString::~FString(&local_40);
        }
        for (iVar1 = local_58; iVar2 = DArgs::NumArgs(Args), pcVar4 = local_50, iVar1 < iVar2;
            iVar1 = iVar1 + 1) {
          pcVar4 = DArgs::GetArg(Args,iVar1);
          FString::FString(&local_48,pcVar4);
          DArgs::AppendArg(this,&local_48);
          FString::~FString(&local_48);
        }
        uVar7 = local_54 + 1;
        Args = this;
        if (uVar7 == 100) {
          uVar7 = 100;
          Printf("Response file limit of %d hit.\n",100);
        }
      }
      if (pcVar4 != (char *)0x0) {
        operator_delete__(pcVar4);
      }
    }
    else {
      iVar8 = iVar8 + 1;
      local_58 = local_58 + 1;
    }
  }
  if (0 < (int)uVar7) {
    pBVar6 = "s";
    if (uVar7 == 1) {
      pBVar6 = "";
    }
    uVar3 = DArgs::NumArgs(Args);
    Printf("Added %d response file%s, now have %d command-line args:\n",(ulong)uVar7,pBVar6,
           (ulong)uVar3);
    for (iVar8 = 1; iVar1 = DArgs::NumArgs(Args), iVar8 < iVar1; iVar8 = iVar8 + 1) {
      pcVar4 = DArgs::GetArg(Args,iVar8);
      Printf("%s\n",pcVar4);
    }
  }
  return;
}

Assistant:

void M_FindResponseFile (void)
{
	const int limit = 100;	// avoid infinite recursion
	int added_stuff = 0;
	int i = 1;

	while (i < Args->NumArgs())
	{
		if (Args->GetArg(i)[0] != '@')
		{
			i++;
		}
		else
		{
			char	**argv;
			char	*file = NULL;
			int		argc = 0;
			FILE	*handle;
			int 	size;
			long	argsize = 0;
			int 	index;

			// Any more response files after the limit will be removed from the
			// command line.
			if (added_stuff < limit)
			{
				// READ THE RESPONSE FILE INTO MEMORY
				handle = fopen (Args->GetArg(i) + 1,"rb");
				if (!handle)
				{ // [RH] Make this a warning, not an error.
					Printf ("No such response file (%s)!\n", Args->GetArg(i) + 1);
				}
				else
				{
					Printf ("Found response file %s!\n", Args->GetArg(i) + 1);
					fseek (handle, 0, SEEK_END);
					size = ftell (handle);
					fseek (handle, 0, SEEK_SET);
					file = new char[size+1];
					fread (file, size, 1, handle);
					file[size] = 0;
					fclose (handle);

					argsize = ParseCommandLine (file, &argc, NULL);
				}
			}
			else
			{
				Printf ("Ignored response file %s.\n", Args->GetArg(i) + 1);
			}

			if (argc != 0)
			{
				argv = (char **)M_Malloc (argc*sizeof(char *) + argsize);
				argv[0] = (char *)argv + argc*sizeof(char *);
				ParseCommandLine (file, NULL, argv);

				// Create a new argument vector
				DArgs *newargs = new DArgs;

				// Copy parameters before response file.
				for (index = 0; index < i; ++index)
					newargs->AppendArg(Args->GetArg(index));

				// Copy parameters from response file.
				for (index = 0; index < argc; ++index)
					newargs->AppendArg(argv[index]);

				// Copy parameters after response file.
				for (index = i + 1; index < Args->NumArgs(); ++index)
					newargs->AppendArg(Args->GetArg(index));

				// Use the new argument vector as the global Args object.
				Args = newargs;
				if (++added_stuff == limit)
				{
					Printf("Response file limit of %d hit.\n", limit);
				}
			}
			else
			{
				// Remove the response file from the Args object
				Args->RemoveArg(i);
			}
			if (file != NULL)
			{
				delete[] file;
			}
		}
	}
	if (added_stuff > 0)
	{
		// DISPLAY ARGS
		Printf ("Added %d response file%s, now have %d command-line args:\n",
			added_stuff, added_stuff > 1 ? "s" : "", Args->NumArgs ());
		for (int k = 1; k < Args->NumArgs (); k++)
			Printf ("%s\n", Args->GetArg (k));
	}
}